

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

void sysbvm_gc_markPointer(void *userdata,sysbvm_tuple_t *pointerAddress)

{
  sysbvm_object_tuple_t *objectTuple;
  sysbvm_tuple_t pointer;
  ulong local_8;
  
  local_8 = *pointerAddress;
  if (((local_8 & 0xf) == 0 && local_8 != 0) &&
     ((*(uint *)(local_8 + 8) & 3) == *(uint *)((long)userdata + 0x30))) {
    *(uint *)(local_8 + 8) = *(uint *)(local_8 + 8) & 0xfffffffc | *(uint *)((long)userdata + 0x34);
    sysbvm_dynarray_add((sysbvm_dynarray_t *)((long)userdata + 0x22a8),&local_8);
  }
  return;
}

Assistant:

static void sysbvm_gc_markPointer(void *userdata, sysbvm_tuple_t *pointerAddress)
{
    sysbvm_context_t *context = (sysbvm_context_t*)userdata;

    sysbvm_tuple_t pointer = *pointerAddress;
    if(!sysbvm_tuple_isNonNullPointer(pointer))
        return;

    bool isWhite = sysbvm_tuple_getGCColor(pointer) == context->heap.gcWhiteColor;
    if(!isWhite)
        return;

    sysbvm_tuple_setGCColor(pointer, context->heap.gcGrayColor);
    sysbvm_dynarray_add(&context->markingStack, &pointer);
}